

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddCollateType(Parse *pParse,Token *pToken)

{
  Table *pTVar1;
  sqlite3 *db_00;
  int iVar2;
  char *zName;
  CollSeq *pCVar3;
  Index *local_40;
  Index *pIdx;
  sqlite3 *db;
  char *zColl;
  int i;
  Table *p;
  Token *pToken_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    iVar2 = pTVar1->nCol + -1;
    db_00 = pParse->db;
    zName = sqlite3NameFromToken(db_00,pToken);
    if (zName != (char *)0x0) {
      pCVar3 = sqlite3LocateCollSeq(pParse,zName);
      if (pCVar3 == (CollSeq *)0x0) {
        sqlite3DbFree(db_00,zName);
      }
      else {
        pTVar1->aCol[iVar2].zColl = zName;
        for (local_40 = pTVar1->pIndex; local_40 != (Index *)0x0; local_40 = local_40->pNext) {
          if (*local_40->aiColumn == iVar2) {
            *local_40->azColl = pTVar1->aCol[iVar2].zColl;
          }
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCollateType(Parse *pParse, Token *pToken){
  Table *p;
  int i;
  char *zColl;              /* Dequoted name of collation sequence */
  sqlite3 *db;

  if( (p = pParse->pNewTable)==0 ) return;
  i = p->nCol-1;
  db = pParse->db;
  zColl = sqlite3NameFromToken(db, pToken);
  if( !zColl ) return;

  if( sqlite3LocateCollSeq(pParse, zColl) ){
    Index *pIdx;
    p->aCol[i].zColl = zColl;
  
    /* If the column is declared as "<name> PRIMARY KEY COLLATE <type>",
    ** then an index may have been created on this column before the
    ** collation type was added. Correct this if it is the case.
    */
    for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->nColumn==1 );
      if( pIdx->aiColumn[0]==i ){
        pIdx->azColl[0] = p->aCol[i].zColl;
      }
    }
  }else{
    sqlite3DbFree(db, zColl);
  }
}